

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util_test.cpp
# Opt level: O3

void __thiscall
ot::commissioner::FileUtil_WriteFile_Test::~FileUtil_WriteFile_Test(FileUtil_WriteFile_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(FileUtil, WriteFile)
{
    FILE       *f    = nullptr;
    std::string path = "./test_write";
    std::string test = "test";
    std::string alt  = "alt";
    std::string read;

    rmdir(path.c_str());
    unlink(path.c_str());
    // initial write
    read.clear();
    EXPECT_EQ(WriteFile(test, path), ErrorCode::kNone);
    EXPECT_EQ(ReadFile(read, path), ErrorCode::kNone);
    EXPECT_EQ(read, test);
    // re-write the same file
    read.clear();
    EXPECT_EQ(WriteFile(alt, path), ErrorCode::kNone);
    EXPECT_EQ(ReadFile(read, path), ErrorCode::kNone);
    EXPECT_EQ(read, alt);
    // write to a blocked file
    EXPECT_TRUE((f = fopen(path.c_str(), "r")) != nullptr);
    EXPECT_EQ(fchmod(fileno(f), 0), 0);
    EXPECT_EQ(WriteFile(test, path), ErrorCode::kIOBusy);

    if (f != nullptr)
    {
        fclose(f);
    }
    unlink(path.c_str());
    // write to an already existing directory named same as the file
    EXPECT_EQ(RestoreDirPath(path), ErrorCode::kNone);
    EXPECT_EQ(WriteFile(test, path), ErrorCode::kAlreadyExists);
    rmdir(path.c_str());
}